

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void I400ToARGBRow_AVX2(uint8_t *y_buf,uint8_t *dst_argb,YuvConstants *yuvconstants,int width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  bool bVar4;
  undefined1 auVar5 [32];
  int iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 in_ZMM4 [64];
  int width_local;
  
  auVar2 = *(undefined1 (*) [32])yuvconstants->kYToRgb;
  auVar3 = *(undefined1 (*) [32])yuvconstants->kYBiasToRgb;
  auVar8 = vpcmpeqb_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
  auVar8 = vpslld_avx2(auVar8,0x18);
  do {
    auVar1 = *(undefined1 (*) [16])y_buf;
    y_buf = (uint8_t *)((long)y_buf + 0x10);
    auVar7 = vpermq_avx2(ZEXT1632(auVar1),0xd8);
    auVar7 = vpunpcklbw_avx2(auVar7,auVar7);
    auVar7 = vpmulhuw_avx2(auVar7,auVar2);
    auVar7 = vpaddsw_avx2(auVar7,auVar3);
    auVar7 = vpsraw_avx2(auVar7,6);
    auVar7 = vpackuswb_avx2(auVar7,auVar7);
    auVar7 = vpunpcklbw_avx2(auVar7,auVar7);
    auVar5 = vpermq_avx2(auVar7,0xd8);
    auVar7 = vpunpcklwd_avx2(auVar5,auVar5);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar5);
    auVar7 = vpor_avx2(auVar7,auVar8);
    auVar5 = vpor_avx2(auVar5,auVar8);
    *(undefined1 (*) [32])dst_argb = auVar7;
    *(undefined1 (*) [32])((long)dst_argb + 0x20) = auVar5;
    dst_argb = (uint8_t *)((long)dst_argb + 0x40);
    iVar6 = width + -0x10;
    bVar4 = 0xf < width;
    width = iVar6;
  } while (iVar6 != 0 && bVar4);
  return;
}

Assistant:

void I400ToARGBRow_AVX2(const uint8_t* y_buf,
                        uint8_t* dst_argb,
                        const struct YuvConstants* yuvconstants,
                        int width) {
  asm volatile(
      "vmovdqa     192(%3),%%ymm2                \n"  // yg = 18997 = 1.164
      "vmovdqa     224(%3),%%ymm3                \n"  // ygb = -1160 = 1.164*16
      "vpcmpeqb    %%ymm4,%%ymm4,%%ymm4          \n"  // 0xff000000
      "vpslld      $0x18,%%ymm4,%%ymm4           \n"

      LABELALIGN
      "1:                                        \n"
      // Step 1: Scale Y contribution to 16 G values. G = (y - 16) * 1.164
      "vmovdqu    (%0),%%xmm0                    \n"
      "lea        0x10(%0),%0                    \n"
      "vpermq     $0xd8,%%ymm0,%%ymm0            \n"
      "vpunpcklbw %%ymm0,%%ymm0,%%ymm0           \n"
      "vpmulhuw   %%ymm2,%%ymm0,%%ymm0           \n"
      "vpaddsw    %%ymm3,%%ymm0,%%ymm0           \n"
      "vpsraw     $0x6,%%ymm0,%%ymm0             \n"
      "vpackuswb  %%ymm0,%%ymm0,%%ymm0           \n"
      "vpunpcklbw %%ymm0,%%ymm0,%%ymm1           \n"
      "vpermq     $0xd8,%%ymm1,%%ymm1            \n"
      "vpunpcklwd %%ymm1,%%ymm1,%%ymm0           \n"
      "vpunpckhwd %%ymm1,%%ymm1,%%ymm1           \n"
      "vpor       %%ymm4,%%ymm0,%%ymm0           \n"
      "vpor       %%ymm4,%%ymm1,%%ymm1           \n"
      "vmovdqu    %%ymm0,(%1)                    \n"
      "vmovdqu    %%ymm1,0x20(%1)                \n"
      "lea        0x40(%1),%1                     \n"
      "sub        $0x10,%2                       \n"
      "jg        1b                              \n"
      "vzeroupper                                \n"
      : "+r"(y_buf),       // %0
        "+r"(dst_argb),    // %1
        "+rm"(width)       // %2
      : "r"(yuvconstants)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4");
}